

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c++
# Opt level: O2

ArrayPtr<const_char> kj::anon_unknown_0::split(StringPtr *text,CharGroup_ *chars)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ArrayPtr<const_char> AVar7;
  
  pcVar1 = (text->content).ptr;
  sVar2 = (text->content).size_;
  sVar5 = sVar2 - 1;
  sVar4 = 0;
  sVar6 = 1;
  pcVar3 = "";
  do {
    if (sVar5 == sVar4) {
LAB_0029f8d9:
      (text->content).ptr = pcVar3;
      (text->content).size_ = sVar6;
      AVar7.size_ = sVar5;
      AVar7.ptr = pcVar1;
      return AVar7;
    }
    if ((chars->bits[(byte)pcVar1[sVar4] >> 6] >> ((ulong)(byte)pcVar1[sVar4] & 0x3f) & 1) != 0) {
      pcVar3 = pcVar1 + sVar4;
      sVar6 = sVar2 - sVar4;
      sVar5 = sVar4;
      goto LAB_0029f8d9;
    }
    sVar4 = sVar4 + 1;
  } while( true );
}

Assistant:

ArrayPtr<const char> split(StringPtr& text, const parse::CharGroup_& chars) {
  for (auto i: kj::indices(text)) {
    if (chars.contains(text[i])) {
      ArrayPtr<const char> result = text.slice(0, i);
      text = text.slice(i);
      return result;
    }
  }
  auto result = text.asArray();
  text = "";
  return result;
}